

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.h
# Opt level: O0

void __thiscall Gecko::FunctionalQuasiconvex::~FunctionalQuasiconvex(FunctionalQuasiconvex *this)

{
  Functional *in_RDI;
  
  Functional::~Functional(in_RDI);
  return;
}

Assistant:

Float optimum(const std::vector<WeightedValue>& v, Float lmin) const
  {
    // Compute the optimum as the node position that minimizes the
    // functional.  Any nodes coincident with each candidate position
    // are excluded from the functional.
    Float x = v[0].value;
    Float min = GECKO_FLOAT_MAX;
    switch (v.size()) {
      case 1:
        // Only one choice.
        break;
      case 2:
        // Functional is the same for both nodes; pick node with
        // larger weight.
        if (v[1].weight > v[0].weight)
          x = v[1].value;
        break;
      default: 
        for (std::vector<WeightedValue>::const_iterator p = v.begin(); p != v.end(); p++) {
          WeightedSum s;
          for (std::vector<WeightedValue>::const_iterator q = v.begin(); q != v.end(); q++) {
            Float l = std::fabs(p->value - q->value);
            if (l > lmin)
              accumulate(s, WeightedValue(l, q->weight));
          }
          Float f = mean(s);
          if (f < min) {
            min = f;
            x = p->value;
          }
        }
        break;
    }
    return x;
  }